

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

void Abc_SclWriteSurface(Vec_Str_t *vOut,SC_Surface *p)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  Vec_StrPutI(vOut,(p->vIndex0).nSize);
  if (0 < (p->vIndex0).nSize) {
    lVar4 = 0;
    do {
      Vec_StrPutF(vOut,(p->vIndex0).pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vIndex0).nSize);
  }
  Vec_StrPutI(vOut,(p->vIndex1).nSize);
  if (0 < (p->vIndex1).nSize) {
    lVar4 = 0;
    do {
      Vec_StrPutF(vOut,(p->vIndex1).pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vIndex1).nSize);
  }
  iVar2 = (p->vData).nSize;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      pvVar1 = (p->vData).pArray[lVar4];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar3 = 0;
        do {
          Vec_StrPutF(vOut,*(float *)(*(long *)((long)pvVar1 + 8) + lVar3 * 4));
          lVar3 = lVar3 + 1;
        } while (lVar3 < *(int *)((long)pvVar1 + 4));
        iVar2 = (p->vData).nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  lVar4 = 0;
  do {
    Vec_StrPutF(vOut,p->approx[0][lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    Vec_StrPutF(vOut,p->approx[1][lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    Vec_StrPutF(vOut,p->approx[2][lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return;
}

Assistant:

static void Abc_SclWriteSurface( Vec_Str_t * vOut, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    Vec_StrPutI( vOut, Vec_FltSize(&p->vIndex0) );
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        Vec_StrPutF( vOut, Entry );

    Vec_StrPutI( vOut, Vec_FltSize(&p->vIndex1) );
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        Vec_StrPutF( vOut, Entry );

    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
        Vec_FltForEachEntry( vVec, Entry, k )
            Vec_StrPutF( vOut, Entry );

    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF( vOut, p->approx[0][i] );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF( vOut, p->approx[1][i] );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF( vOut, p->approx[2][i] );
}